

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3WasmString.h
# Opt level: O0

PCH __thiscall WasmString::c_str(WasmString *this)

{
  char *pcVar1;
  ulong uVar2;
  PCH pcVar3;
  PCH pcVar4;
  allocator local_31;
  string local_30 [32];
  WasmString *local_10;
  WasmString *this_local;
  
  local_10 = this;
  if (this->data == (PCH)0x0) {
    pcVar3 = (PCH)std::__cxx11::string::c_str();
    this->data = pcVar3;
  }
  else {
    pcVar3 = this->data;
    pcVar4 = (PCH)std::__cxx11::string::c_str();
    if (pcVar3 != pcVar4) {
      pcVar1 = this->data;
      uVar2 = this->size;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,pcVar1,uVar2,&local_31);
      std::__cxx11::string::operator=((string *)&this->storage,local_30);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      pcVar3 = (PCH)std::__cxx11::string::c_str();
      this->data = pcVar3;
    }
  }
  return this->data;
}

Assistant:

PCH c_str ()
    {
        if (!data)
        {
            data = (PCH)storage.c_str ();
        }
        else if (data != storage.c_str ())
        {
            storage = std::string (data, size);
            data = (PCH)storage.c_str ();
        }
        return data;
    }